

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ratio.cpp
# Opt level: O1

string * __thiscall Ratio::toStringCombType_abi_cxx11_(string *__return_storage_ptr__,Ratio *this)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  pointer pPVar4;
  ostringstream ss;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{",1);
  pPVar4 = (this->eEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->eEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
      super__Vector_impl_data._M_finish != pPVar4) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      iVar1 = PhyloTreeEdge::getOriginalID
                        ((PhyloTreeEdge *)
                         ((long)&(pPVar4->super_Bipartition)._vptr_Bipartition + lVar3));
      std::ostream::operator<<((ostream *)local_1a8,iVar1);
      if (uVar2 < ((long)(this->eEdges).
                         super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(this->eEdges).
                         super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7 - 1U) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
      }
      uVar2 = uVar2 + 1;
      pPVar4 = (this->eEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x48;
    } while (uVar2 < (ulong)(((long)(this->eEdges).
                                    super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar4 >> 3)
                            * -0x71c71c71c71c71c7));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}/{",3);
  pPVar4 = (this->fEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->fEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
      super__Vector_impl_data._M_finish != pPVar4) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      iVar1 = PhyloTreeEdge::getOriginalID
                        ((PhyloTreeEdge *)
                         ((long)&(pPVar4->super_Bipartition)._vptr_Bipartition + lVar3));
      std::ostream::operator<<((ostream *)local_1a8,iVar1);
      if (uVar2 < ((long)(this->fEdges).
                         super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(this->fEdges).
                         super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7 - 1U) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
      }
      uVar2 = uVar2 + 1;
      pPVar4 = (this->fEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x48;
    } while (uVar2 < (ulong)(((long)(this->fEdges).
                                    super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar4 >> 3)
                            * -0x71c71c71c71c71c7));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

string Ratio::toStringCombType() {
    ostringstream ss;
    ss << "{";

    for (size_t i = 0; i < eEdges.size(); i++) {
        ss << eEdges[i].getOriginalID();
        if (i < eEdges.size() - 1) {
            ss << ",";
        }
    }
    ss << "}/{";

    for (size_t i = 0; i < fEdges.size(); i++) {
        ss << fEdges[i].getOriginalID();
        if (i < fEdges.size() - 1) {
            ss << ",";
        }
    }
    ss << "}";
    return ss.str();
}